

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall
GlobOpt::InsertCloneStrs
          (GlobOpt *this,BasicBlock *toBlock,GlobOptBlockData *toData,GlobOptBlockData *fromData)

{
  Type TVar1;
  Loop *pLVar2;
  BasicBlock *this_00;
  SymTable *this_01;
  ValueInfo *pVVar3;
  Func *func;
  Instr *this_02;
  Type pJVar4;
  Type pBVar5;
  long lVar6;
  code *pcVar7;
  bool bVar8;
  BOOLEAN BVar9;
  byte bVar10;
  BVSparse<Memory::JitArenaAllocator> *pBVar11;
  undefined4 *puVar12;
  StackSym *sym;
  Value *pVVar13;
  Value *pVVar14;
  Instr *this_03;
  RegOpnd *newDst;
  Type_conflict pBVar15;
  SymID id;
  Type_conflict pBVar16;
  ulong uVar17;
  ulong uVar18;
  
  if ((((toBlock->field_0x18 & 4) != 0) &&
      (toBlock->cloneStrCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0)) &&
     (this->prePassLoop == (Loop *)0x0)) {
    pLVar2 = toBlock->loop;
    this_00 = pLVar2->landingPad;
    pBVar11 = this->tempBv;
    this_01 = this->func->m_symTable;
    do {
      pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)pBVar11->head;
      if (pBVar11 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_004250d9;
    } while (((Type *)&pBVar11->alloc)->word == 0);
    if (pBVar11 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x1574,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
      if (!bVar8) {
LAB_0042540e:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar12 = 0;
    }
LAB_004250d9:
    BVSparse<Memory::JitArenaAllocator>::And
              (this->tempBv,toBlock->cloneStrCandidates,fromData->isTempSrc);
    pBVar16 = this->tempBv->head;
    if (pBVar16 != (Type_conflict)0x0) {
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        uVar17 = (pBVar16->data).word;
        if (uVar17 != 0) {
          TVar1 = pBVar16->startIndex;
          uVar18 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
            }
          }
          do {
            id = (BVIndex)uVar18 + TVar1;
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar18);
            sym = (StackSym *)SymTable::Find(this_01,id);
            if (sym == (StackSym *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar12 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                 ,0x1579,"(sym)","sym");
              if (!bVar8) goto LAB_0042540e;
              *puVar12 = 0;
            }
            BVar9 = BVSparse<Memory::JitArenaAllocator>::Test((this_00->globOptData).liveVarSyms,id)
            ;
            if (((BVar9 != '\0') &&
                (BVar9 = BVSparse<Memory::JitArenaAllocator>::Test(fromData->liveVarSyms,id),
                BVar9 != '\0')) &&
               ((pVVar13 = GlobOptBlockData::FindValue(&this_00->globOptData,(Sym *)sym),
                pVVar13 != (Value *)0x0 &&
                (pVVar14 = GlobOptBlockData::FindValue(fromData,(Sym *)sym), pVVar14 != (Value *)0x0
                )))) {
              pVVar3 = pVVar14->valueInfo;
              bVar8 = ValueType::IsLikelyString(&pVVar13->valueInfo->super_ValueType);
              if ((bVar8) && (bVar8 = ValueType::IsLikelyString(&pVVar3->super_ValueType), bVar8)) {
                this_03 = IR::Instr::New(CloneStr,this->func);
                newDst = IR::RegOpnd::New(sym,TyVar,this->func);
                IR::Instr::SetDst(this_03,&newDst->super_Opnd);
                if (this_03->m_src1 != (Opnd *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                     ,0x16c,"(this->m_src1 == __null)",
                                     "Trying to overwrite existing src.");
                  if (!bVar8) goto LAB_0042540e;
                  *puVar12 = 0;
                }
                func = this_03->m_func;
                if ((newDst->super_Opnd).isDeleted == true) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar12 = 1;
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x14,"(!isDeleted)","Using deleted operand");
                  if (!bVar8) goto LAB_0042540e;
                  *puVar12 = 0;
                }
                bVar10 = (newDst->super_Opnd).field_0xb;
                if ((bVar10 & 2) != 0) {
                  newDst = (RegOpnd *)IR::Opnd::Copy(&newDst->super_Opnd,func);
                  bVar10 = (newDst->super_Opnd).field_0xb;
                }
                (newDst->super_Opnd).field_0xb = bVar10 | 2;
                this_03->m_src1 = &newDst->super_Opnd;
                this_02 = pLVar2->bailOutInfo->bailOutInstr;
                if (this_02 == (Instr *)0x0) {
                  BasicBlock::InsertAfter(this_00,this_03);
                }
                else {
                  IR::Instr::InsertBefore(this_02,this_03);
                }
                BVSparse<Memory::JitArenaAllocator>::Set(toData->isTempSrc,id);
              }
            }
            uVar17 = uVar17 & ~(1L << (uVar18 & 0x3f));
            lVar6 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
              }
            }
            uVar18 = (ulong)(-(uint)(uVar17 == 0) | (uint)lVar6);
          } while (uVar17 != 0);
        }
        pBVar16 = pBVar16->next;
      } while (pBVar16 != (Type)0x0);
    }
    pBVar11 = this->tempBv;
    if (pBVar11->head != (Type_conflict)0x0) {
      pJVar4 = pBVar11->alloc;
      pBVar5 = pBVar11->head;
      pBVar16 = pJVar4->bvFreeList;
      do {
        pBVar15 = pBVar5;
        pBVar5 = pBVar15->next;
        pBVar15->next = pBVar16;
        pBVar16 = pBVar15;
      } while (pBVar5 != (Type)0x0);
      pJVar4->bvFreeList = pBVar15;
    }
    pBVar11->head = (Type_conflict)0x0;
    pBVar11->lastFoundIndex = (Type_conflict)0x0;
    pBVar11->lastUsedNodePrevNextField = &pBVar11->head;
  }
  return;
}

Assistant:

void GlobOpt::InsertCloneStrs(BasicBlock *toBlock, GlobOptBlockData *toData, GlobOptBlockData *fromData)
{
    if (toBlock->isLoopHeader   // isLoopBackEdge
        && toBlock->cloneStrCandidates
        && !IsLoopPrePass())
    {
        Loop *loop = toBlock->loop;
        BasicBlock *landingPad = loop->landingPad;
        const SymTable *const symTable = func->m_symTable;
        Assert(tempBv->IsEmpty());
        tempBv->And(toBlock->cloneStrCandidates, fromData->isTempSrc);
        FOREACH_BITSET_IN_SPARSEBV(id, tempBv)
        {
            StackSym *const sym = (StackSym *)symTable->Find(id);
            Assert(sym);

            if (!landingPad->globOptData.liveVarSyms->Test(id)
                || !fromData->liveVarSyms->Test(id))
            {
                continue;
            }

            Value * landingPadValue = landingPad->globOptData.FindValue(sym);
            if (landingPadValue == nullptr)
            {
                continue;
            }

            Value * loopValue = fromData->FindValue(sym);
            if (loopValue == nullptr)
            {
                continue;
            }

            ValueInfo *landingPadValueInfo = landingPadValue->GetValueInfo();
            ValueInfo *loopValueInfo = loopValue->GetValueInfo();

            if (landingPadValueInfo->IsLikelyString()
                && loopValueInfo->IsLikelyString())
            {
                IR::Instr *cloneStr = IR::Instr::New(Js::OpCode::CloneStr, this->func);
                IR::RegOpnd *opnd = IR::RegOpnd::New(sym, IRType::TyVar, this->func);
                cloneStr->SetDst(opnd);
                cloneStr->SetSrc1(opnd);
                if (loop->bailOutInfo->bailOutInstr)
                {
                    loop->bailOutInfo->bailOutInstr->InsertBefore(cloneStr);
                }
                else
                {
                    landingPad->InsertAfter(cloneStr);
                }
                toData->isTempSrc->Set(id);
            }
        }
        NEXT_BITSET_IN_SPARSEBV;
        tempBv->ClearAll();
    }
}